

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

_Bool ggml_can_repeat(ggml_tensor *t0,ggml_tensor *t1)

{
  _Bool _Var1;
  
  _Var1 = ggml_is_empty(t0);
  if (_Var1) {
    _Var1 = ggml_is_empty(t1);
    return _Var1;
  }
  if (((t1->ne[0] % t0->ne[0] == 0) && (t1->ne[1] % t0->ne[1] == 0)) && (t1->ne[2] % t0->ne[2] == 0)
     ) {
    _Var1 = t1->ne[3] % t0->ne[3] == 0;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool ggml_can_repeat(const struct ggml_tensor * t0, const struct ggml_tensor * t1) {
    static_assert(GGML_MAX_DIMS == 4, "GGML_MAX_DIMS is not 4 - update this function");

    return ggml_is_empty(t0) ? ggml_is_empty(t1) :
        (t1->ne[0]%t0->ne[0] == 0) &&
        (t1->ne[1]%t0->ne[1] == 0) &&
        (t1->ne[2]%t0->ne[2] == 0) &&
        (t1->ne[3]%t0->ne[3] == 0);
}